

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_3,_1,_0,_3,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
               *src,assign_op<double,_double> *func)

{
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_28;
  ActualDstType actualDst;
  assign_op<double,_double> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  *src_local;
  Matrix<double,_3,_1,_0,_3,_1> *dst_local;
  
  actualDst.m_matrix = (non_const_type)func;
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Transpose(&local_28,dst);
  Assignment<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_28,src,(assign_op<double,_double> *)actualDst.m_matrix);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}